

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O0

void __thiscall
ObjectFileDB::add_obj_from_dgo
          (ObjectFileDB *this,string *obj_name,uint8_t *obj_data,uint32_t obj_size,string *dgo_name)

{
  bool bVar1;
  uchar *__dest;
  mapped_type *this_00;
  size_type sVar2;
  ObjectFileData *__args;
  ObjectFileData *this_01;
  uint in_ECX;
  void *in_RDX;
  string *in_RSI;
  long in_RDI;
  ObjectFileData data;
  ObjectFileRecord rec;
  ObjectFileData *e;
  iterator __end1;
  iterator __begin1;
  mapped_type *__range1;
  uint32_t hash;
  ObjectFileRecord *in_stack_fffffffffffffe18;
  ObjectFileData *in_stack_fffffffffffffe20;
  value_type *in_stack_fffffffffffffe28;
  vector<ObjectFileData,_std::allocator<ObjectFileData>_> *in_stack_fffffffffffffe30;
  size_type in_stack_fffffffffffffe38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8 [10];
  string local_b8 [32];
  undefined4 local_98;
  uint32_t local_94;
  reference local_50;
  ObjectFileData *local_48;
  __normal_iterator<ObjectFileData_*,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>
  local_40;
  mapped_type *local_38;
  uint32_t local_2c;
  uint local_1c;
  void *local_18;
  string *local_10;
  
  *(int *)(in_RDI + 0x8c) = *(int *)(in_RDI + 0x8c) + 1;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_2c = crc32((uint8_t *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
  local_38 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>_>
                           *)in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->name);
  local_40._M_current =
       (ObjectFileData *)
       std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>::begin
                 ((vector<ObjectFileData,_std::allocator<ObjectFileData>_> *)
                  in_stack_fffffffffffffe18);
  local_48 = (ObjectFileData *)
             std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>::end
                       ((vector<ObjectFileData,_std::allocator<ObjectFileData>_> *)
                        in_stack_fffffffffffffe18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<ObjectFileData_*,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>
                        *)in_stack_fffffffffffffe20,
                       (__normal_iterator<ObjectFileData_*,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>
                        *)in_stack_fffffffffffffe18);
    if (!bVar1) {
      this_02 = local_1a8;
      ObjectFileData::ObjectFileData(in_stack_fffffffffffffe20);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (this_02,in_stack_fffffffffffffe38);
      __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x192c13);
      memcpy(__dest,local_18,(ulong)local_1c);
      local_94 = local_2c;
      std::__cxx11::string::operator=(local_b8,local_10);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>_>
      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>_>
                    *)in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->name);
      bVar1 = std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>::empty
                        (in_stack_fffffffffffffe30);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffe30,&in_stack_fffffffffffffe28->name);
      }
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>_>
                              *)in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->name);
      sVar2 = std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>::size(this_00);
      local_98 = (undefined4)sVar2;
      __args = (ObjectFileData *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>_>_>_>
                             *)in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->name);
      std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>::push_back
                ((vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_> *)this_00,
                 (value_type *)__args);
      this_01 = (ObjectFileData *)
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>_>
                              *)in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->name);
      std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>::emplace_back<ObjectFileData>
                (this_00,__args);
      *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + 1;
      *(uint *)(in_RDI + 0x94) = local_1c + *(int *)(in_RDI + 0x94);
      ObjectFileData::~ObjectFileData(this_01);
      return;
    }
    local_50 = __gnu_cxx::
               __normal_iterator<ObjectFileData_*,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>
               ::operator*(&local_40);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_50->data);
    if ((sVar2 == local_1c) && ((local_50->record).hash == local_2c)) break;
    __gnu_cxx::
    __normal_iterator<ObjectFileData_*,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>
    ::operator++(&local_40);
  }
  local_50->reference_count = local_50->reference_count + 1;
  ObjectFileRecord::ObjectFileRecord
            ((ObjectFileRecord *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>_>_>_>
  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>_>_>_>
                *)in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->name);
  std::vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_>::push_back
            ((vector<ObjectFileRecord,_std::allocator<ObjectFileRecord>_> *)
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  ObjectFileRecord::~ObjectFileRecord((ObjectFileRecord *)0x192ba6);
  return;
}

Assistant:

void ObjectFileDB::add_obj_from_dgo(const std::string& obj_name,
                                    uint8_t* obj_data,
                                    uint32_t obj_size,
                                    const std::string& dgo_name) {
  stats.total_obj_files++;

  auto hash = crc32(obj_data, obj_size);

  // first, check to see if we already got it...
  for (auto& e : obj_files_by_name[obj_name]) {
    if (e.data.size() == obj_size && e.record.hash == hash) {
      // already got it!
      e.reference_count++;
      auto rec = e.record;
      obj_files_by_dgo[dgo_name].push_back(rec);
      return;
    }
  }

  // nope, have to add a new one.
  ObjectFileData data;
  data.data.resize(obj_size);
  memcpy(data.data.data(), obj_data, obj_size);
  data.record.hash = hash;
  data.record.name = obj_name;
  if (obj_files_by_name[obj_name].empty()) {
    // if this is the first time we've seen this object file name, add it in the order.
    obj_file_order.push_back(obj_name);
  }
  data.record.version = obj_files_by_name[obj_name].size();
  obj_files_by_dgo[dgo_name].push_back(data.record);
  obj_files_by_name[obj_name].emplace_back(std::move(data));
  stats.unique_obj_files++;
  stats.unique_obj_bytes += obj_size;
}